

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O3

void duckdb::MinMaxBase::
     ConstantOperation<duckdb::uhugeint_t,duckdb::MinMaxState<duckdb::uhugeint_t>,duckdb::MinOperation>
               (MinMaxState<duckdb::uhugeint_t> *state,uhugeint_t *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  bool bVar1;
  uhugeint_t local_18;
  
  local_18.lower = input->lower;
  local_18.upper = input->upper;
  if (state->isset == false) {
    (state->value).lower = local_18.lower;
    (state->value).upper = local_18.upper;
    state->isset = true;
  }
  else {
    bVar1 = uhugeint_t::operator>(&state->value,&local_18);
    if (bVar1) {
      (state->value).lower = local_18.lower;
      (state->value).upper = local_18.upper;
    }
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		if (!state.isset) {
			OP::template Assign<INPUT_TYPE, STATE>(state, input, unary_input.input);
			state.isset = true;
		} else {
			OP::template Execute<INPUT_TYPE, STATE>(state, input, unary_input.input);
		}
	}